

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::BinaryAssertionExpr::fromSyntax(BinaryPropertyExprSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  AssertionExpr *pAVar3;
  Compilation *this;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BinaryAssertionExpr *pBVar5;
  bitmask<slang::ast::ASTFlags> addedFlags;
  bitmask<slang::ast::ASTFlags> addedFlags_00;
  socklen_t __len;
  BinaryAssertionOperator op;
  Token *local_78;
  Compilation *local_70;
  SourceRange local_68;
  AssertionExpr *this_00;
  
  TVar1 = (syntax->op).kind;
  addedFlags.m_bits = 0;
  addedFlags_00.m_bits = 0x400000;
  if ((TVar1 != HashEqualsHash) && (TVar1 != OrEqualsArrow)) {
    addedFlags.m_bits =
         (ulong)((syntax->super_PropertyExprSyntax).super_SyntaxNode.kind - SUntilPropertyExpr < 2)
         << 0x15;
    addedFlags_00.m_bits = addedFlags.m_bits;
  }
  __len = 1;
  if ((TVar1 != HashMinusHash) && (TVar1 != OrMinusArrow)) {
    __len = (uint)(TVar1 == HashEqualsHash || TVar1 == OrEqualsArrow) * 2;
  }
  local_78 = &syntax->op;
  local_70 = ((context->scope).ptr)->compilation;
  pAVar3 = (AssertionExpr *)(syntax->left).ptr;
  ASTContext::resetFlags((ASTContext *)&local_68,context,addedFlags);
  iVar4 = AssertionExpr::bind(pAVar3,(int)(ASTContext *)&local_68,(sockaddr *)0x0,__len);
  this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar4);
  pAVar3 = (AssertionExpr *)(syntax->right).ptr;
  ASTContext::resetFlags((ASTContext *)&local_68,context,addedFlags_00);
  iVar4 = AssertionExpr::bind(pAVar3,(int)(ASTContext *)&local_68,(sockaddr *)0x0,0);
  SVar2 = (syntax->super_PropertyExprSyntax).super_SyntaxNode.kind;
  if (SVar2 == UntilWithPropertyExpr) {
    op = UntilWith;
  }
  else if (SVar2 == FollowedByPropertyExpr) {
    AssertionExpr::requireSequence(this_00,context,(DiagCode)0x370008);
    op = (local_78->kind != HashMinusHash) + OverlappedFollowedBy;
  }
  else if (SVar2 == IffPropertyExpr) {
    op = Iff;
  }
  else if (SVar2 == ImplicationPropertyExpr) {
    AssertionExpr::requireSequence(this_00,context,(DiagCode)0x370008);
    op = (local_78->kind != OrMinusArrow) + OverlappedImplication;
  }
  else if (SVar2 == ImpliesPropertyExpr) {
    op = Implies;
  }
  else if (SVar2 == OrPropertyExpr) {
    op = Or;
  }
  else if (SVar2 == SUntilPropertyExpr) {
    op = SUntil;
  }
  else if (SVar2 == SUntilWithPropertyExpr) {
    op = SUntilWith;
  }
  else if (SVar2 == UntilPropertyExpr) {
    op = Until;
  }
  else {
    op = And;
  }
  this = local_70;
  local_68 = parsing::Token::range(local_78);
  pBVar5 = BumpAllocator::
           emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
                     (&this->super_BumpAllocator,&op,this_00,
                      (AssertionExpr *)CONCAT44(extraout_var_00,iVar4),&local_68);
  return &pBVar5->super_AssertionExpr;
}

Assistant:

AssertionExpr& BinaryAssertionExpr::fromSyntax(const BinaryPropertyExprSyntax& syntax,
                                               const ASTContext& context) {
    const bool isOverlapOp = (syntax.op.kind == TokenKind::OrMinusArrow) ||
                             (syntax.op.kind == TokenKind::HashMinusHash);
    const bool isNonOverlapOp = (syntax.op.kind == TokenKind::OrEqualsArrow) ||
                                (syntax.op.kind == TokenKind::HashEqualsHash);

    bitmask<ASTFlags> lflags, rflags;
    if (isNonOverlapOp) {
        rflags = ASTFlags::PropertyTimeAdvance;
    }
    else if (syntax.kind == SyntaxKind::SUntilPropertyExpr ||
             syntax.kind == SyntaxKind::SUntilWithPropertyExpr) {
        lflags = rflags = ASTFlags::PropertyNegation;
    }

    NondegeneracyRequirement nondegenRequirement = NondegeneracyRequirement::Default;
    if (isOverlapOp)
        nondegenRequirement = NondegeneracyRequirement::OverlapOp;
    else if (isNonOverlapOp)
        nondegenRequirement = NondegeneracyRequirement::NonOverlapOp;

    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context.resetFlags(lflags), false, nondegenRequirement);
    auto& right = bind(*syntax.right, context.resetFlags(rflags));

    // clang-format off
    BinaryAssertionOperator op;
    switch (syntax.kind) {
        case SyntaxKind::AndPropertyExpr: op = BinaryAssertionOperator::And; break;
        case SyntaxKind::OrPropertyExpr: op = BinaryAssertionOperator::Or; break;
        case SyntaxKind::IffPropertyExpr: op = BinaryAssertionOperator::Iff; break;
        case SyntaxKind::UntilPropertyExpr: op = BinaryAssertionOperator::Until; break;
        case SyntaxKind::SUntilPropertyExpr: op = BinaryAssertionOperator::SUntil; break;
        case SyntaxKind::UntilWithPropertyExpr: op = BinaryAssertionOperator::UntilWith; break;
        case SyntaxKind::SUntilWithPropertyExpr: op = BinaryAssertionOperator::SUntilWith; break;
        case SyntaxKind::ImpliesPropertyExpr: op = BinaryAssertionOperator::Implies; break;
        case SyntaxKind::ImplicationPropertyExpr:
            left.requireSequence(context, diag::PropertyLhsInvalid);
            op = syntax.op.kind == TokenKind::OrMinusArrow ? BinaryAssertionOperator::OverlappedImplication :
                                                             BinaryAssertionOperator::NonOverlappedImplication;
            break;
        case SyntaxKind::FollowedByPropertyExpr:
            left.requireSequence(context, diag::PropertyLhsInvalid);
            op = syntax.op.kind == TokenKind::HashMinusHash ? BinaryAssertionOperator::OverlappedFollowedBy :
                                                              BinaryAssertionOperator::NonOverlappedFollowedBy;
            break;
        default:
            SLANG_UNREACHABLE;
    }
    // clang-format on

    return *comp.emplace<BinaryAssertionExpr>(op, left, right, syntax.op.range());
}